

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  GPU_Target *screen_00;
  GPU_Target *screen;
  char **argv_local;
  int argc_local;
  
  screen_00 = GPU_Init(800,600,0);
  if (screen_00 == (GPU_Target *)0x0) {
    argv_local._4_4_ = -1;
  }
  else {
    main_loop(screen_00);
    GPU_Quit();
    argv_local._4_4_ = 0;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[])
{
	GPU_Target* screen;
	
	screen = GPU_Init(800, 600, GPU_DEFAULT_INIT_FLAGS);
	if(screen == NULL)
		return -1;
	
	main_loop(screen);
	
	GPU_Quit();
	
	return 0;
}